

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.h
# Opt level: O0

uint64 crnlib::math::next_pow2(uint64 val)

{
  ulong uVar1;
  uint64 val_local;
  
  uVar1 = val - 1 >> 0x20 | val - 1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 2 | uVar1;
  return (uVar1 >> 1 | uVar1) + 1;
}

Assistant:

inline uint64 next_pow2(uint64 val)
        {
            val--;
            val |= val >> 32;
            val |= val >> 16;
            val |= val >> 8;
            val |= val >> 4;
            val |= val >> 2;
            val |= val >> 1;
            return val + 1;
        }